

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O0

void __thiscall nvim::NvimRPC::async_call<long,long>(NvimRPC *this,string *method,long *u,long *u_1)

{
  packer<msgpack::v1::sbuffer> *o;
  type ppVar1;
  char *pcVar2;
  void *__buf;
  NvimRPC *__n;
  uint64_t local_68 [4];
  packer<msgpack::v1::sbuffer> local_48;
  Packer pk;
  sbuffer sbuf;
  long *u_local_1;
  long *u_local;
  string *method_local;
  NvimRPC *this_local;
  
  msgpack::v1::sbuffer::sbuffer((sbuffer *)&pk,0x2000);
  msgpack::v1::packer<msgpack::v1::sbuffer>::packer(&local_48,(sbuffer *)&pk);
  o = msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&local_48,4);
  local_68[1] = 0;
  ppVar1 = msgpack::v1::operator<<(o,local_68 + 1);
  local_68[0] = this->msgid_;
  this->msgid_ = local_68[0] + 1;
  __n = this;
  ppVar1 = msgpack::v1::operator<<(ppVar1,local_68);
  msgpack::v1::operator<<(ppVar1,method);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&local_48,2);
  nvim::detail::pack<long,long>(&local_48,u,u_1);
  pcVar2 = msgpack::v1::sbuffer::data((sbuffer *)&pk);
  __buf = (void *)msgpack::v1::sbuffer::size((sbuffer *)&pk);
  Socket::write(&this->socket_,(int)pcVar2,__buf,(size_t)__n);
  msgpack::v1::sbuffer::~sbuffer((sbuffer *)&pk);
  return;
}

Assistant:

void NvimRPC::async_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    socket_.write(sbuf.data(), sbuf.size(), 5);
}